

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * gettxout(void)

{
  string name;
  string name_00;
  string name_01;
  string cond;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string cond_00;
  string name_02;
  string m_key_name_08;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string m_key_name_09;
  string description_09;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_10;
  string description_11;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  RPCExamples examples;
  string description_12;
  string description_13;
  string description_14;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar1 [32];
  long lVar2;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> results_00;
  undefined4 in_stack_ffffffffffffebc8;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffebcc;
  undefined1 in_stack_ffffffffffffebd0 [24];
  undefined8 in_stack_ffffffffffffebe8;
  undefined8 in_stack_ffffffffffffebf0;
  _Manager_type in_stack_ffffffffffffebf8;
  undefined8 in_stack_ffffffffffffec00;
  undefined1 in_stack_ffffffffffffec08 [16];
  pointer in_stack_ffffffffffffec18;
  pointer pRVar4;
  pointer in_stack_ffffffffffffec20;
  pointer pRVar5;
  pointer in_stack_ffffffffffffec28;
  pointer pRVar6;
  pointer in_stack_ffffffffffffec30;
  pointer in_stack_ffffffffffffec38;
  pointer pRVar7;
  pointer in_stack_ffffffffffffec40;
  pointer pRVar8;
  pointer in_stack_ffffffffffffec48;
  pointer pRVar9;
  undefined8 in_stack_ffffffffffffec50;
  pointer in_stack_ffffffffffffec58;
  pointer pRVar10;
  pointer in_stack_ffffffffffffec60;
  pointer pRVar11;
  pointer in_stack_ffffffffffffec68;
  pointer pRVar12;
  _Invoker_type in_stack_ffffffffffffec70;
  pointer in_stack_ffffffffffffec78;
  pointer in_stack_ffffffffffffec80;
  pointer in_stack_ffffffffffffec88;
  undefined8 in_stack_ffffffffffffec90;
  pointer in_stack_ffffffffffffec98;
  pointer in_stack_ffffffffffffeca0;
  pointer in_stack_ffffffffffffeca8;
  allocator<char> local_134a;
  allocator<char> local_1349;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1348;
  allocator<char> local_132a;
  allocator<char> local_1329;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1328;
  allocator<char> local_130a;
  allocator<char> local_1309;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1308;
  allocator<char> local_12e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12e8;
  allocator<char> local_12ca;
  allocator<char> local_12c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12c8;
  allocator<char> local_12aa;
  allocator<char> local_12a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  allocator<char> local_128b;
  allocator<char> local_128a;
  allocator<char> local_1289;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1288;
  allocator<char> local_1263;
  allocator<char> local_1262;
  allocator<char> local_1261;
  RPCResults local_1260;
  allocator_type local_1248;
  allocator<char> local_1247;
  bool local_1246;
  allocator<char> local_1245;
  allocator<char> local_1244;
  allocator<char> local_1243;
  allocator<char> local_1242;
  allocator<char> local_1241;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1240;
  allocator<char> local_1222;
  allocator<char> local_1221;
  string local_1220;
  string local_1200;
  string local_11e0;
  string local_11c0;
  string local_11a0;
  string local_1180;
  string local_1160;
  string local_1140;
  string local_1120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080;
  char *local_1060;
  size_type local_1058;
  char local_1050 [8];
  undefined8 uStack_1048;
  string local_1040 [16];
  undefined8 local_1030;
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  RPCResult local_ec0 [4];
  RPCResult local_ca0;
  string local_c18 [32];
  string local_bf8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  RPCResult local_b18 [4];
  RPCResult local_8f8;
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  RPCResult local_7b0 [2];
  RPCArgOptions local_6a0;
  string local_658 [32];
  UniValue local_638;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5e0;
  string local_580 [32];
  RPCArgOptions local_560;
  string local_518 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  string local_498 [32];
  RPCArgOptions local_478;
  string local_430 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  string local_3b0 [32];
  RPCArg local_390 [3];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"gettxout",&local_1221);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"\nReturns details about an unspent transaction output.\n",&local_1222);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"txid",&local_1241);
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_430,"The transaction id",&local_1242);
  local_478.oneline_description._M_dataplus._M_p = (pointer)&local_478.oneline_description.field_2;
  local_478.skip_type_check = false;
  local_478.oneline_description._M_string_length = 0;
  local_478.oneline_description.field_2._M_local_buf[0] = '\0';
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_478._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  name._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffebd0._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffebf0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffebe8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffebf8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffec00;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffec08;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffec20;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffec28;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffec30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffec38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffec40;
  description_12._M_string_length = in_stack_ffffffffffffec50;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec48;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec58;
  description_12.field_2._8_8_ = in_stack_ffffffffffffec60;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec70;
  opts._0_8_ = in_stack_ffffffffffffec68;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffec78;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec80;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffec88;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffec90;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffec98;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeca0;
  opts._64_8_ = in_stack_ffffffffffffeca8;
  RPCArg::RPCArg(local_390,name,(Type)local_3b0,fallback,description_12,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_498,"n",&local_1243);
  local_4f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_4a0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_518,"vout number",&local_1244);
  local_560.oneline_description._M_dataplus._M_p = (pointer)&local_560.oneline_description.field_2;
  local_560.skip_type_check = false;
  local_560.oneline_description._M_string_length = 0;
  local_560.oneline_description.field_2._M_local_buf[0] = '\0';
  local_560.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_560.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_560.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_560.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_560._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  name_00._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffebf0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffebe8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffebf8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffec00;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffec08;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec18;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffec20;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffec28;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffec30;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffec38;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffec40;
  description_13._M_string_length = in_stack_ffffffffffffec50;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec48;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec58;
  description_13.field_2._8_8_ = in_stack_ffffffffffffec60;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec70;
  opts_00._0_8_ = in_stack_ffffffffffffec68;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffec78;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec80;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffec88;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffec90;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffec98;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeca0;
  opts_00._64_8_ = in_stack_ffffffffffffeca8;
  RPCArg::RPCArg(local_390 + 1,name_00,(Type)local_498,fallback_00,description_13,opts_00);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"include_mempool",&local_1245);
  local_1246 = true;
  UniValue::UniValue<bool,_bool,_true>(&local_638,&local_1246);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_5e0,&local_638);
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,
             "Whether to include the mempool. Note that an unspent output that is spent in the mempool won\'t appear."
             ,&local_1247);
  local_6a0.oneline_description._M_dataplus._M_p = (pointer)&local_6a0.oneline_description.field_2;
  local_6a0.skip_type_check = false;
  local_6a0.oneline_description._M_string_length = 0;
  local_6a0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_6a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_6a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_6a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_6a0._58_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  name_01._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffebf0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffebe8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffebf8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffec00;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffec08;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec18;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffec20;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffec28;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffec30;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffec38;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffec40;
  description_14._M_string_length = in_stack_ffffffffffffec50;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec48;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec58;
  description_14.field_2._8_8_ = in_stack_ffffffffffffec60;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec70;
  opts_01._0_8_ = in_stack_ffffffffffffec68;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffec78;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec80;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffec88;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffec90;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffec98;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeca0;
  opts_01._64_8_ = in_stack_ffffffffffffeca8;
  RPCArg::RPCArg(local_390 + 2,name_01,(Type)local_580,fallback_01,description_14,opts_01);
  __l._M_len = 3;
  __l._M_array = local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1240,__l,&local_1248);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7d0,"If the UTXO was not found",&local_1261);
  std::__cxx11::string::string<std::allocator<char>>(local_7f0,"",&local_1262);
  std::__cxx11::string::string<std::allocator<char>>(local_810,"",&local_1263);
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  cond._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  cond._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  cond.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffebd0._8_16_;
  m_key_name_08._M_string_length = in_stack_ffffffffffffebf0;
  m_key_name_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  m_key_name_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffec00;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec18;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec08._0_8_;
  description_10._M_string_length = in_stack_ffffffffffffec08._8_8_;
  description_10.field_2._8_8_ = in_stack_ffffffffffffec20;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffec30;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffec28;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec38;
  RPCResult::RPCResult(local_7b0,cond,(Type)local_7d0,m_key_name_08,description_10,inner_09);
  std::__cxx11::string::string<std::allocator<char>>(local_830,"Otherwise",&local_1289);
  std::__cxx11::string::string<std::allocator<char>>(local_850,"",&local_128a);
  std::__cxx11::string::string<std::allocator<char>>(local_870,"",&local_128b);
  std::__cxx11::string::string<std::allocator<char>>(local_b38,"bestblock",&local_12a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b58,"The hash of the block at the tip of the chain",&local_12aa);
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  m_key_name._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description._M_string_length = in_stack_ffffffffffffebf0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffec18;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult(local_b18,STR_HEX,m_key_name,description,inner,SUB81(local_b38,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b78,"confirmations",&local_12c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b98,"The number of confirmations",&local_12ca);
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  m_key_name_00._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description_00._M_string_length = in_stack_ffffffffffffebf0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec18;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult(local_b18 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_b78,0));
  std::__cxx11::string::string<std::allocator<char>>(local_bb8,"value",&local_12e9);
  std::operator+(&local_bd8,"The transaction value in ",&CURRENCY_UNIT_abi_cxx11_);
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  m_key_name_01._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description_01._M_string_length = in_stack_ffffffffffffebf0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec18;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult
            (local_b18 + 2,STR_AMOUNT,m_key_name_01,description_01,inner_01,SUB81(local_bb8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_bf8,"scriptPubKey",&local_1309);
  std::__cxx11::string::string<std::allocator<char>>(local_c18,"",&local_130a);
  std::__cxx11::string::string<std::allocator<char>>(local_ee0,"asm",&local_1329);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f00,"Disassembly of the output script",&local_132a);
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  m_key_name_02._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description_02._M_string_length = in_stack_ffffffffffffebf0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec18;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult(local_ec0,STR,m_key_name_02,description_02,inner_02,SUB81(local_ee0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f20,"desc",&local_1349);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f40,"Inferred descriptor for the output",&local_134a);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  m_key_name_03._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description_03._M_string_length = in_stack_ffffffffffffebf0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec18;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult(local_ec0 + 1,STR,m_key_name_03,description_03,inner_03,SUB81(local_f20,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_f60,"hex",(allocator<char> *)&stack0xffffffffffffec97);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f80,"The raw output script bytes, hex-encoded",
             (allocator<char> *)&stack0xffffffffffffec96);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  m_key_name_04._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description_04._M_string_length = in_stack_ffffffffffffebf0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec18;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult
            (local_ec0 + 2,STR_HEX,m_key_name_04,description_04,inner_04,SUB81(local_f60,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_fa0,"type",(allocator<char> *)&stack0xffffffffffffec77);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fc0,"The type, eg pubkeyhash",(allocator<char> *)&stack0xffffffffffffec76);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebc8;
  m_key_name_05._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description_05._M_string_length = in_stack_ffffffffffffebf0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec18;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult(local_ec0 + 3,STR,m_key_name_05,description_05,inner_05,SUB81(local_fa0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_fe0,"address",(allocator<char> *)&stack0xffffffffffffec57);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1000,"The Bitcoin address (only if a well-defined address exists)",
             (allocator<char> *)&stack0xffffffffffffec56);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  uVar3 = 0;
  auVar1._4_24_ = in_stack_ffffffffffffebd0;
  auVar1._0_4_ = in_stack_ffffffffffffebcc;
  auVar1._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffebf0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec18;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult
            (&local_ca0,STR,(string)(auVar1 << 0x20),SUB81(local_fe0,0),description_06,inner_06,true
            );
  __l_00._M_len = 5;
  __l_00._M_array = local_ec0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1328,__l_00,(allocator_type *)&stack0xffffffffffffec37);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_06._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description_07._M_string_length = in_stack_ffffffffffffebf0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec18;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult(local_b18 + 3,OBJ,m_key_name_06,description_07,inner_07,SUB81(local_bf8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1020,"coinbase",(allocator<char> *)&stack0xffffffffffffec36);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1040,"Coinbase or not",(allocator<char> *)&stack0xffffffffffffec35);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_07._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  m_key_name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  description_08._M_string_length = in_stack_ffffffffffffebf0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffec00;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec08._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec08._8_8_;
  RPCResult::RPCResult(&local_8f8,BOOL,m_key_name_07,description_08,inner_08,SUB81(local_1020,0));
  __l_01._M_len = 5;
  __l_01._M_array = local_b18;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_12a8,__l_01,(allocator_type *)&stack0xffffffffffffec17);
  cond_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebcc;
  cond_00._M_dataplus._M_p._0_4_ = uVar3;
  cond_00._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  cond_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  m_key_name_09._M_string_length = in_stack_ffffffffffffebf0;
  m_key_name_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe8;
  m_key_name_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebf8;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffec00;
  description_11.field_2._M_allocated_capacity = (size_type)pRVar4;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec08._0_8_;
  description_11._M_string_length = in_stack_ffffffffffffec08._8_8_;
  description_11.field_2._8_8_ = pRVar5;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffec30;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar6;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar7;
  RPCResult::RPCResult(local_7b0 + 1,cond_00,(Type)local_830,m_key_name_09,description_11,inner_10);
  results_00._M_len = 2;
  results_00._M_array = local_7b0;
  RPCResults::RPCResults(&local_1260,results_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1140,"listunspent",(allocator<char> *)&stack0xffffffffffffec16);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1160,"",(allocator<char> *)&stack0xffffffffffffec15);
  HelpExampleCli(&local_1120,&local_1140,&local_1160);
  std::operator+(&local_1100,"\nGet unspent transactions\n",&local_1120);
  std::operator+(&local_10e0,&local_1100,"\nView the details\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11a0,"gettxout",(allocator<char> *)&stack0xffffffffffffec14);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11c0,"\"txid\" 1",(allocator<char> *)&stack0xffffffffffffec13);
  HelpExampleCli(&local_1180,&local_11a0,&local_11c0);
  std::operator+(&local_10c0,&local_10e0,&local_1180);
  std::operator+(&local_10a0,&local_10c0,"\nAs a JSON-RPC call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1200,"gettxout",(allocator<char> *)&stack0xffffffffffffec12);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1220,"\"txid\", 1",(allocator<char> *)&stack0xffffffffffffec11);
  HelpExampleRpc(&local_11e0,&local_1200,&local_1220);
  std::operator+(&local_1080,&local_10a0,&local_11e0);
  local_1060 = local_1050;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1080._M_dataplus._M_p == &local_1080.field_2) {
    uStack_1048 = local_1080.field_2._8_8_;
  }
  else {
    local_1060 = local_1080._M_dataplus._M_p;
  }
  local_1058 = local_1080._M_string_length;
  local_1080._M_string_length = 0;
  local_1080.field_2._M_local_buf[0] = '\0';
  name_02._M_string_length = in_stack_ffffffffffffebd0._0_8_;
  name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffebd0._8_16_;
  name_02._M_dataplus._M_p = &stack0xffffffffffffebe8;
  description_09.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1129:9)>
       ::_M_manager;
  description_09._M_dataplus._M_p = (pointer)0x0;
  description_09._M_string_length = 0;
  description_09.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1129:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffec08._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffec08._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar6;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffec30;
  examples.m_examples._M_string_length = (size_type)pRVar8;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar9;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffec50;
  fun.super__Function_base._M_functor._8_8_ = pRVar11;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar12;
  fun._M_invoker = in_stack_ffffffffffffec70;
  local_1080._M_dataplus._M_p = (pointer)&local_1080.field_2;
  RPCHelpMan::RPCHelpMan(in_RDI,name_02,description_09,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffebe8);
  std::__cxx11::string::~string((string *)&local_1060);
  std::__cxx11::string::~string((string *)&local_1080);
  std::__cxx11::string::~string((string *)&local_11e0);
  std::__cxx11::string::~string((string *)&local_1220);
  std::__cxx11::string::~string((string *)&local_1200);
  std::__cxx11::string::~string((string *)&local_10a0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::__cxx11::string::~string((string *)&local_1180);
  std::__cxx11::string::~string((string *)&local_11c0);
  std::__cxx11::string::~string((string *)&local_11a0);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::__cxx11::string::~string((string *)&local_1100);
  std::__cxx11::string::~string((string *)&local_1120);
  std::__cxx11::string::~string((string *)&local_1160);
  std::__cxx11::string::~string((string *)&local_1140);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1260.m_results);
  lVar2 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_7b0[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  lVar2 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_b18[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec18);
  std::__cxx11::string::~string(local_1040);
  std::__cxx11::string::~string(local_1020);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1328);
  lVar2 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_ec0[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec38);
  std::__cxx11::string::~string(local_1000);
  std::__cxx11::string::~string(local_fe0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec58);
  std::__cxx11::string::~string(local_fc0);
  std::__cxx11::string::~string(local_fa0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec78);
  std::__cxx11::string::~string(local_f80);
  std::__cxx11::string::~string(local_f60);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec98);
  std::__cxx11::string::~string(local_f40);
  std::__cxx11::string::~string(local_f20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1348);
  std::__cxx11::string::~string(local_f00);
  std::__cxx11::string::~string(local_ee0);
  std::__cxx11::string::~string(local_c18);
  std::__cxx11::string::~string(local_bf8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1308);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::__cxx11::string::~string(local_bb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12e8);
  std::__cxx11::string::~string(local_b98);
  std::__cxx11::string::~string(local_b78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12c8);
  std::__cxx11::string::~string(local_b58);
  std::__cxx11::string::~string(local_b38);
  std::__cxx11::string::~string(local_870);
  std::__cxx11::string::~string(local_850);
  std::__cxx11::string::~string(local_830);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1288);
  std::__cxx11::string::~string(local_810);
  std::__cxx11::string::~string(local_7f0);
  std::__cxx11::string::~string(local_7d0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1240);
  lVar2 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_390[0].m_names._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x108;
  } while (lVar2 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_6a0);
  std::__cxx11::string::~string(local_658);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_5e0);
  UniValue::~UniValue(&local_638);
  std::__cxx11::string::~string(local_580);
  RPCArgOptions::~RPCArgOptions(&local_560);
  std::__cxx11::string::~string(local_518);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  std::__cxx11::string::~string(local_498);
  RPCArgOptions::~RPCArgOptions(&local_478);
  std::__cxx11::string::~string(local_430);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan gettxout()
{
    return RPCHelpMan{"gettxout",
        "\nReturns details about an unspent transaction output.\n",
        {
            {"txid", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction id"},
            {"n", RPCArg::Type::NUM, RPCArg::Optional::NO, "vout number"},
            {"include_mempool", RPCArg::Type::BOOL, RPCArg::Default{true}, "Whether to include the mempool. Note that an unspent output that is spent in the mempool won't appear."},
        },
        {
            RPCResult{"If the UTXO was not found", RPCResult::Type::NONE, "", ""},
            RPCResult{"Otherwise", RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at the tip of the chain"},
                {RPCResult::Type::NUM, "confirmations", "The number of confirmations"},
                {RPCResult::Type::STR_AMOUNT, "value", "The transaction value in " + CURRENCY_UNIT},
                {RPCResult::Type::OBJ, "scriptPubKey", "", {
                    {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
                    {RPCResult::Type::STR, "desc", "Inferred descriptor for the output"},
                    {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
                    {RPCResult::Type::STR, "type", "The type, eg pubkeyhash"},
                    {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                }},
                {RPCResult::Type::BOOL, "coinbase", "Coinbase or not"},
            }},
        },
        RPCExamples{
            "\nGet unspent transactions\n"
            + HelpExampleCli("listunspent", "") +
            "\nView the details\n"
            + HelpExampleCli("gettxout", "\"txid\" 1") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("gettxout", "\"txid\", 1")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    LOCK(cs_main);

    UniValue ret(UniValue::VOBJ);

    auto hash{Txid::FromUint256(ParseHashV(request.params[0], "txid"))};
    COutPoint out{hash, request.params[1].getInt<uint32_t>()};
    bool fMempool = true;
    if (!request.params[2].isNull())
        fMempool = request.params[2].get_bool();

    Coin coin;
    Chainstate& active_chainstate = chainman.ActiveChainstate();
    CCoinsViewCache* coins_view = &active_chainstate.CoinsTip();

    if (fMempool) {
        const CTxMemPool& mempool = EnsureMemPool(node);
        LOCK(mempool.cs);
        CCoinsViewMemPool view(coins_view, mempool);
        if (!view.GetCoin(out, coin) || mempool.isSpent(out)) {
            return UniValue::VNULL;
        }
    } else {
        if (!coins_view->GetCoin(out, coin)) {
            return UniValue::VNULL;
        }
    }

    const CBlockIndex* pindex = active_chainstate.m_blockman.LookupBlockIndex(coins_view->GetBestBlock());
    ret.pushKV("bestblock", pindex->GetBlockHash().GetHex());
    if (coin.nHeight == MEMPOOL_HEIGHT) {
        ret.pushKV("confirmations", 0);
    } else {
        ret.pushKV("confirmations", (int64_t)(pindex->nHeight - coin.nHeight + 1));
    }
    ret.pushKV("value", ValueFromAmount(coin.out.nValue));
    UniValue o(UniValue::VOBJ);
    ScriptToUniv(coin.out.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
    ret.pushKV("scriptPubKey", std::move(o));
    ret.pushKV("coinbase", (bool)coin.fCoinBase);

    return ret;
},
    };
}